

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  char *__s;
  internal *local_70;
  allocator<char> local_51;
  String local_50 [2];
  allocator<char> local_29;
  internal *local_28;
  char *file_name;
  internal *piStack_18;
  int line_local;
  char *file_local;
  
  file_name._4_4_ = (int)file;
  local_70 = this;
  if (this == (internal *)0x0) {
    local_70 = (internal *)0x1fa1ab;
  }
  local_28 = local_70;
  piStack_18 = this;
  file_local = (char *)__return_storage_ptr__;
  if (file_name._4_4_ < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)local_70,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    String::Format(local_50,"%s:%d",local_70,(ulong)file & 0xffffffff);
    __s = String::c_str(local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_51);
    std::allocator<char>::~allocator(&local_51);
    String::~String(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0)
    return file_name;
  else
    return String::Format("%s:%d", file_name, line).c_str();
}